

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrowingArray.h
# Opt level: O1

void __thiscall
JsUtil::GrowingArray<unsigned_int,_Memory::HeapAllocator>::~GrowingArray
          (GrowingArray<unsigned_int,_Memory::HeapAllocator> *this)

{
  if (this->buffer != (Type)0x0) {
    if (0x3fffffff < (ulong)this->length) {
      Math::DefaultOverflowPolicy();
    }
    Memory::HeapAllocator::Free(this->alloc,this->buffer,(ulong)this->length << 2);
  }
  return;
}

Assistant:

~GrowingArray()
        {
            if (buffer != nullptr)
            {
                AllocatorFree(alloc, (TypeAllocatorFunc<TAllocator, int>::GetFreeFunc()), buffer, UInt32Math::Mul(length, sizeof(TValue)));
            }
        }